

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

uint __thiscall
wasm::Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
          (Visitor<wasm::CostAnalyzer,_unsigned_int> *this,Expression *curr)

{
  byte bVar1;
  ulong uVar2;
  CostType CVar3;
  uint uVar4;
  long lVar5;
  Expression *pEVar6;
  int iVar7;
  
  if (curr == (Expression *)0x0) {
LAB_009363ba:
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<wasm::CostAnalyzer, unsigned int>::visit(Expression *) [SubType = wasm::CostAnalyzer, ReturnType = unsigned int]"
                 );
  }
  iVar7 = 1;
LAB_00935f86:
  switch((((ResumeThrow *)curr)->super_SpecificExpression<(wasm::Expression::Id)94>).
         super_Expression._id) {
  case BlockId:
    CVar3 = CostAnalyzer::visitBlock((CostAnalyzer *)this,(Block *)curr);
    break;
  case IfId:
    CVar3 = CostAnalyzer::visitIf((CostAnalyzer *)this,(If *)curr);
    break;
  case LoopId:
    curr = (Expression *)
           (((ResumeThrow *)curr)->handlerTags).
           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
    iVar7 = iVar7 * 5;
    goto LAB_00935fb8;
  case BreakId:
    CVar3 = CostAnalyzer::visitBreak((CostAnalyzer *)this,(Break *)curr);
    break;
  case SwitchId:
    CVar3 = CostAnalyzer::visitSwitch((CostAnalyzer *)this,(Switch *)curr);
    break;
  case CallId:
    CVar3 = CostAnalyzer::visitCall((CostAnalyzer *)this,(Call *)curr);
    break;
  case CallIndirectId:
    CVar3 = CostAnalyzer::visitCallIndirect((CostAnalyzer *)this,(CallIndirect *)curr);
    break;
  case LocalGetId:
  case NopId:
  case UnreachableId:
  case PopId:
switchD_00935f9b_caseD_8:
    CVar3 = 0;
    break;
  case LocalSetId:
  case SIMDExtractId:
  case RefAsId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_str;
    goto LAB_0093638c;
  case GlobalGetId:
  case ConstId:
  case MemorySizeId:
  case RefNullId:
  case RefFuncId:
  case TableSizeId:
    CVar3 = 1;
    break;
  case GlobalSetId:
    pEVar6 = (Expression *)
             (((ResumeThrow *)curr)->handlerTags).
             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
    goto LAB_00936320;
  case LoadId:
    uVar4 = visit(this,(Expression *)
                       (((ResumeThrow *)curr)->handlerTags).
                       super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements)
    ;
    bVar1 = (byte)(((ResumeThrow *)curr)->handlerTags).
                  super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
    CVar3 = uVar4 + ((uint)bVar1 + (uint)bVar1 * 4) * 2 + 1;
    break;
  case StoreId:
    CVar3 = CostAnalyzer::visitStore((CostAnalyzer *)this,(Store *)curr);
    break;
  case UnaryId:
    CVar3 = CostAnalyzer::visitUnary((CostAnalyzer *)this,(Unary *)curr);
    break;
  case BinaryId:
    CVar3 = CostAnalyzer::visitBinary((CostAnalyzer *)this,(Binary *)curr);
    break;
  case SelectId:
    CVar3 = CostAnalyzer::visitSelect((CostAnalyzer *)this,(Select *)curr);
    break;
  case DropId:
  case TryTableId:
  case TupleExtractId:
    lVar5 = 0x10;
    goto LAB_00935fb4;
  case ReturnId:
    curr = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
    if ((ResumeThrow *)curr == (ResumeThrow *)0x0) goto switchD_00935f9b_caseD_8;
    goto LAB_00935fb8;
  case MemoryGrowId:
    uVar4 = visit(this,(Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len);
    CVar3 = uVar4 + 0x14;
    break;
  case AtomicRMWId:
    CVar3 = CostAnalyzer::visitAtomicRMW((CostAnalyzer *)this,(AtomicRMW *)curr);
    break;
  case AtomicCmpxchgId:
    CVar3 = CostAnalyzer::visitAtomicCmpxchg((CostAnalyzer *)this,(AtomicCmpxchg *)curr);
    break;
  case AtomicWaitId:
    CVar3 = CostAnalyzer::visitAtomicWait((CostAnalyzer *)this,(AtomicWait *)curr);
    break;
  case AtomicNotifyId:
    CVar3 = CostAnalyzer::visitAtomicNotify((CostAnalyzer *)this,(AtomicNotify *)curr);
    break;
  case AtomicFenceId:
  case RethrowId:
  case ThrowRefId:
    CVar3 = 10;
    break;
  case SIMDReplaceId:
    CVar3 = CostAnalyzer::visitSIMDReplace((CostAnalyzer *)this,(SIMDReplace *)curr);
    break;
  case SIMDShuffleId:
    CVar3 = CostAnalyzer::visitSIMDShuffle((CostAnalyzer *)this,(SIMDShuffle *)curr);
    break;
  case SIMDTernaryId:
    CVar3 = CostAnalyzer::visitSIMDTernary((CostAnalyzer *)this,(SIMDTernary *)curr);
    break;
  case SIMDShiftId:
    CVar3 = CostAnalyzer::visitSIMDShift((CostAnalyzer *)this,(SIMDShift *)curr);
    break;
  case SIMDLoadId:
    pEVar6 = (Expression *)
             (((ResumeThrow *)curr)->handlerTags).
             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
    goto LAB_0093638c;
  case SIMDLoadStoreLaneId:
    CVar3 = CostAnalyzer::visitSIMDLoadStoreLane((CostAnalyzer *)this,(SIMDLoadStoreLane *)curr);
    break;
  case MemoryInitId:
    CVar3 = CostAnalyzer::visitMemoryInit((CostAnalyzer *)this,(MemoryInit *)curr);
    break;
  case DataDropId:
    CVar3 = 5;
    break;
  case MemoryCopyId:
    CVar3 = CostAnalyzer::visitMemoryCopy((CostAnalyzer *)this,(MemoryCopy *)curr);
    break;
  case MemoryFillId:
    CVar3 = CostAnalyzer::visitMemoryFill((CostAnalyzer *)this,(MemoryFill *)curr);
    break;
  case RefIsNullId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
    goto LAB_0093638c;
  case RefEqId:
    CVar3 = CostAnalyzer::visitRefEq((CostAnalyzer *)this,(RefEq *)curr);
    break;
  case TableGetId:
    pEVar6 = (Expression *)
             (((ResumeThrow *)curr)->handlerTags).
             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
LAB_0093638c:
    uVar4 = visit(this,pEVar6);
    CVar3 = uVar4 + 1;
    break;
  case TableSetId:
    CVar3 = CostAnalyzer::visitTableSet((CostAnalyzer *)this,(TableSet *)curr);
    break;
  case TableGrowId:
    CVar3 = CostAnalyzer::visitTableGrow((CostAnalyzer *)this,(TableGrow *)curr);
    break;
  case TableFillId:
    CVar3 = CostAnalyzer::visitTableFill((CostAnalyzer *)this,(TableFill *)curr);
    break;
  case TableCopyId:
    CVar3 = CostAnalyzer::visitTableCopy((CostAnalyzer *)this,(TableCopy *)curr);
    break;
  case TableInitId:
    CVar3 = CostAnalyzer::visitTableInit((CostAnalyzer *)this,(TableInit *)curr);
    break;
  case TryId:
    lVar5 = 0x20;
LAB_00935fb4:
    curr = *(Expression **)
            (&(((ResumeThrow *)curr)->super_SpecificExpression<(wasm::Expression::Id)94>).
              super_Expression._id + lVar5);
LAB_00935fb8:
    if ((ResumeThrow *)curr == (ResumeThrow *)0x0) goto LAB_009363ba;
    goto LAB_00935f86;
  case ThrowId:
    CVar3 = CostAnalyzer::visitThrow((CostAnalyzer *)this,(Throw *)curr);
    break;
  case TupleMakeId:
    CVar3 = CostAnalyzer::visitTupleMake((CostAnalyzer *)this,(TupleMake *)curr);
    break;
  case RefI31Id:
    uVar4 = visit(this,(Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len);
    CVar3 = uVar4 + 3;
    break;
  case I31GetId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
LAB_00936320:
    uVar4 = visit(this,pEVar6);
    CVar3 = uVar4 + 2;
    break;
  case CallRefId:
    CVar3 = CostAnalyzer::visitCallRef((CostAnalyzer *)this,(CallRef *)curr);
    break;
  case RefTestId:
  case RefCastId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
    uVar2 = (pEVar6->type).id;
    uVar4 = visit(this,pEVar6);
    CVar3 = uVar4 + (((uint)uVar2 & 3) == 2 && 6 < uVar2) + 5;
    break;
  case BrOnId:
    CVar3 = CostAnalyzer::visitBrOn((CostAnalyzer *)this,(BrOn *)curr);
    break;
  case StructNewId:
    CVar3 = CostAnalyzer::visitStructNew((CostAnalyzer *)this,(StructNew *)curr);
    break;
  case StructGetId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_str;
    goto LAB_009361f6;
  case StructSetId:
    CVar3 = CostAnalyzer::visitStructSet((CostAnalyzer *)this,(StructSet *)curr);
    break;
  case StructRMWId:
    CVar3 = CostAnalyzer::visitStructRMW((CostAnalyzer *)this,(StructRMW *)curr);
    break;
  case StructCmpxchgId:
    CVar3 = CostAnalyzer::visitStructCmpxchg((CostAnalyzer *)this,(StructCmpxchg *)curr);
    break;
  case ArrayNewId:
    CVar3 = CostAnalyzer::visitArrayNew((CostAnalyzer *)this,(ArrayNew *)curr);
    break;
  case ArrayNewDataId:
    CVar3 = CostAnalyzer::visitArrayNewData((CostAnalyzer *)this,(ArrayNewData *)curr);
    break;
  case ArrayNewElemId:
    CVar3 = CostAnalyzer::visitArrayNewElem((CostAnalyzer *)this,(ArrayNewElem *)curr);
    break;
  case ArrayNewFixedId:
    CVar3 = CostAnalyzer::visitArrayNewFixed((CostAnalyzer *)this,(ArrayNewFixed *)curr);
    break;
  case ArrayGetId:
    CVar3 = CostAnalyzer::visitArrayGet((CostAnalyzer *)this,(ArrayGet *)curr);
    break;
  case ArraySetId:
    CVar3 = CostAnalyzer::visitArraySet((CostAnalyzer *)this,(ArraySet *)curr);
    break;
  case ArrayLenId:
    pEVar6 = (Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len;
LAB_009361f6:
    uVar2 = (pEVar6->type).id;
    uVar4 = visit(this,pEVar6);
    CVar3 = uVar4 + (((uint)uVar2 & 3) == 2 && 6 < uVar2) + 1;
    break;
  case ArrayCopyId:
    CVar3 = CostAnalyzer::visitArrayCopy((CostAnalyzer *)this,(ArrayCopy *)curr);
    break;
  case ArrayFillId:
    CVar3 = CostAnalyzer::visitArrayFill((CostAnalyzer *)this,(ArrayFill *)curr);
    break;
  case ArrayInitDataId:
    CVar3 = CostAnalyzer::visitArrayInitData((CostAnalyzer *)this,(ArrayInitData *)curr);
    break;
  case ArrayInitElemId:
    CVar3 = CostAnalyzer::visitArrayInitElem((CostAnalyzer *)this,(ArrayInitElem *)curr);
    break;
  case StringNewId:
    CVar3 = CostAnalyzer::visitStringNew((CostAnalyzer *)this,(StringNew *)curr);
    break;
  case StringConstId:
    CVar3 = 4;
    break;
  case StringMeasureId:
    uVar4 = visit(this,(Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_str);
    CVar3 = uVar4 + 6;
    break;
  case StringEncodeId:
    CVar3 = CostAnalyzer::visitStringEncode((CostAnalyzer *)this,(StringEncode *)curr);
    break;
  case StringConcatId:
    CVar3 = CostAnalyzer::visitStringConcat((CostAnalyzer *)this,(StringConcat *)curr);
    break;
  case StringEqId:
    CVar3 = CostAnalyzer::visitStringEq((CostAnalyzer *)this,(StringEq *)curr);
    break;
  case StringWTF16GetId:
    CVar3 = CostAnalyzer::visitStringWTF16Get((CostAnalyzer *)this,(StringWTF16Get *)curr);
    break;
  case StringSliceWTFId:
    CVar3 = CostAnalyzer::visitStringSliceWTF((CostAnalyzer *)this,(StringSliceWTF *)curr);
    break;
  case ContNewId:
    uVar4 = visit(this,(Expression *)(((ResumeThrow *)curr)->tag).super_IString.str._M_len);
    CVar3 = uVar4 + 0x6e;
    break;
  case ContBindId:
    CVar3 = CostAnalyzer::visitContBind((CostAnalyzer *)this,(ContBind *)curr);
    break;
  case SuspendId:
    CVar3 = CostAnalyzer::visitSuspend((CostAnalyzer *)this,(Suspend *)curr);
    break;
  case ResumeId:
    CVar3 = CostAnalyzer::visitResume((CostAnalyzer *)this,(Resume *)curr);
    break;
  case ResumeThrowId:
    CVar3 = CostAnalyzer::visitResumeThrow((CostAnalyzer *)this,(ResumeThrow *)curr);
    break;
  case StackSwitchId:
    CVar3 = CostAnalyzer::visitStackSwitch((CostAnalyzer *)this,(StackSwitch *)curr);
    break;
  default:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                       ,0x46);
  }
  return CVar3 * iVar7;
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }